

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcher.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::XPathMatcher::endElement
          (XPathMatcher *this,XMLElementDecl *elemDecl,XMLCh *elemContent,
          ValidationContext *validationContext,DatatypeValidator *actualValidator)

{
  uint uVar1;
  XMLSize_t XVar2;
  int iVar3;
  int iVar4;
  ValueStackOf<unsigned_long> *this_00;
  unsigned_long uVar5;
  undefined4 extraout_var;
  XMLCh *toDelete;
  undefined4 extraout_var_01;
  uchar *puVar6;
  DatatypeValidator *pDVar7;
  XMLSize_t getAt;
  XMLSize_t XVar8;
  XMLBuffer buff;
  ArrayJanitor<char16_t> janPrefix;
  XMLBuffer local_a0;
  XMLSize_t local_68;
  DatatypeValidator *local_60;
  ValidationContext *local_58;
  XMLElementDecl *local_50;
  XMLCh *local_48;
  ArrayJanitor<char16_t> local_40;
  undefined4 extraout_var_00;
  
  if (this->fLocationPathSize != 0) {
    local_48 = elemContent + 1;
    getAt = 0;
    local_60 = actualValidator;
    local_58 = validationContext;
    local_50 = elemDecl;
    do {
      this_00 = BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>::elementAt
                          (&this->fStepIndexes->
                            super_BaseRefVectorOf<xercesc_4_0::ValueStackOf<unsigned_long>_>,getAt);
      uVar5 = ValueStackOf<unsigned_long>::pop(this_00);
      this->fCurrentStep[getAt] = uVar5;
      XVar2 = this->fNoMatchDepth[getAt];
      if (XVar2 == 0) {
        puVar6 = this->fMatched;
        if (puVar6[getAt] != 0) {
          if ((~puVar6[getAt] & 3) != 0) {
            pDVar7 = actualValidator;
            if (actualValidator == (DatatypeValidator *)0x0) {
              pDVar7 = *(DatatypeValidator **)&local_50[2].fCreateReason;
            }
            uVar1 = *(uint *)&local_50[1].fElementName;
            if ((pDVar7 == (DatatypeValidator *)0x0) || (pDVar7->fType != QName)) {
              (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar7,(ulong)(uVar1 & 1));
            }
            else {
              iVar3 = XMLString::indexOf(elemContent,L':');
              if (iVar3 == -1) {
                (*this->_vptr_XPathMatcher[6])(this,elemContent,pDVar7,(ulong)(uVar1 & 1));
                actualValidator = local_60;
              }
              else {
                local_a0.fMemoryManager = this->fMemoryManager;
                local_a0.fIndex = 0;
                local_a0.fCapacity = 0x3ff;
                local_a0.fFullSize = 0;
                local_a0.fUsed = false;
                local_a0.fFullHandler = (XMLBufferFullHandler *)0x0;
                local_a0.fBuffer = (XMLCh *)0x0;
                iVar4 = (*(local_a0.fMemoryManager)->_vptr_MemoryManager[3])
                                  (local_a0.fMemoryManager,0x800);
                actualValidator = local_60;
                local_a0.fBuffer = (XMLCh *)CONCAT44(extraout_var,iVar4);
                *local_a0.fBuffer = L'\0';
                if (local_a0.fIndex == local_a0.fCapacity) {
                  XMLBuffer::ensureCapacity(&local_a0,1);
                }
                XVar2 = local_a0.fIndex + 1;
                local_a0.fBuffer[local_a0.fIndex] = L'{';
                XVar8 = (XMLSize_t)iVar3;
                local_a0.fIndex = XVar2;
                if (local_58 != (ValidationContext *)0x0) {
                  local_68 = XVar8;
                  iVar3 = (*this->fMemoryManager->_vptr_MemoryManager[3])
                                    (this->fMemoryManager,XVar8 * 2 + 2);
                  toDelete = (XMLCh *)CONCAT44(extraout_var_00,iVar3);
                  ArrayJanitor<char16_t>::ArrayJanitor(&local_40,toDelete,this->fMemoryManager);
                  XMLString::subString(toDelete,elemContent,0,local_68,this->fMemoryManager);
                  iVar3 = (*local_58->_vptr_ValidationContext[0xf])(local_58,toDelete);
                  XMLBuffer::append(&local_a0,(XMLCh *)CONCAT44(extraout_var_01,iVar3));
                  ArrayJanitor<char16_t>::~ArrayJanitor(&local_40);
                  XVar8 = local_68;
                }
                if (local_a0.fIndex == local_a0.fCapacity) {
                  XMLBuffer::ensureCapacity(&local_a0,1);
                }
                local_a0.fBuffer[local_a0.fIndex] = L'}';
                local_a0.fIndex = local_a0.fIndex + 1;
                XMLBuffer::append(&local_a0,local_48 + XVar8);
                local_a0.fBuffer[local_a0.fIndex] = L'\0';
                (*this->_vptr_XPathMatcher[6])(this,local_a0.fBuffer,pDVar7,(ulong)(uVar1 & 1));
                (*(local_a0.fMemoryManager)->_vptr_MemoryManager[4])
                          (local_a0.fMemoryManager,local_a0.fBuffer);
              }
            }
            puVar6 = this->fMatched;
          }
          puVar6[getAt] = '\0';
        }
      }
      else {
        this->fNoMatchDepth[getAt] = XVar2 - 1;
      }
      getAt = getAt + 1;
    } while (getAt < this->fLocationPathSize);
  }
  return;
}

Assistant:

void XPathMatcher::endElement(const XMLElementDecl& elemDecl,
                              const XMLCh* const elemContent,
                              ValidationContext* validationContext /*=0*/,
                              DatatypeValidator* actualValidator /*=0*/) {

    for(XMLSize_t i = 0; i < fLocationPathSize; i++) {

        // go back a step
        fCurrentStep[i] = fStepIndexes->elementAt(i)->pop();

        // don't do anything, if not matching
        if (fNoMatchDepth[i] > 0) {
            fNoMatchDepth[i]--;
        }
        // signal match, if appropriate
        else {

            if (fMatched[i] == 0)
                continue;
            
            if ((fMatched[i] & XP_MATCHED_A) == XP_MATCHED_A) {
                fMatched[i] = 0;
                continue;
            }

            DatatypeValidator* dv = actualValidator?actualValidator:((SchemaElementDecl*) &elemDecl)->getDatatypeValidator();
            bool isNillable = (((SchemaElementDecl *) &elemDecl)->getMiscFlags() & SchemaSymbols::XSD_NILLABLE) != 0;

            // store QName using their Clark name
            if(dv && dv->getType()==DatatypeValidator::QName)
            {
                int index=XMLString::indexOf(elemContent, chColon);
                if(index==-1)
                    matched(elemContent, dv, isNillable);
                else
                {
                    XMLBuffer buff(1023, fMemoryManager);
                    buff.append(chOpenCurly);
                    if(validationContext)
                    {
                        XMLCh* prefix=(XMLCh*)fMemoryManager->allocate((index+1)*sizeof(XMLCh));
                        ArrayJanitor<XMLCh> janPrefix(prefix, fMemoryManager);
                        XMLString::subString(prefix, elemContent, 0, (XMLSize_t)index, fMemoryManager);
                        buff.append(validationContext->getURIForPrefix(prefix));
                    }
                    buff.append(chCloseCurly);
                    buff.append(elemContent+index+1);
                    matched(buff.getRawBuffer(), dv, isNillable);
                }
            }
            else
                matched(elemContent, dv, isNillable);
            fMatched[i] = 0;
        }
    }
}